

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntLoadResidual_CqL
          (ChLinkMotorLinearDriveline *this,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,
          double c)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  
  ChLinkMateGeneric::IntLoadResidual_CqL((ChLinkMateGeneric *)this,off_L,R,L,c);
  peVar2 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x25])
            (c,peVar2,(ulong)(iVar1 + off_L),R,L);
  peVar2 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x25])
            (c,peVar2,(ulong)(iVar1 + 1 + off_L),R,L);
  peVar3 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x25])
            (c,peVar3,(ulong)(iVar1 + 2 + off_L),R,L);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::IntLoadResidual_CqL(const unsigned int off_L,
                                       ChVectorDynamic<>& R,
                                       const ChVectorDynamic<>& L,
                                       const double c) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntLoadResidual_CqL(off_L, R, L, c);

    int nc = mask.nconstr;
    innerconstraint1lin->IntLoadResidual_CqL(off_L + nc + 0, R, L, c);
    innerconstraint2lin->IntLoadResidual_CqL(off_L + nc + 1, R, L, c);
    innerconstraint2rot->IntLoadResidual_CqL(off_L + nc + 2, R, L, c);
}